

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_18fc05::SQLiteBuildDB::open(SQLiteBuildDB *this,char *__file,int __oflag,...)

{
  sqlite3 **ppsVar1;
  int iVar2;
  int iVar3;
  uint __val;
  undefined8 in_RAX;
  char *pcVar4;
  undefined8 uVar5;
  int *piVar6;
  allocator local_25d;
  allocator local_25c;
  allocator local_25b;
  allocator local_25a;
  allocator local_259;
  sqlite3_stmt *stmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  char *cError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (this->db != (sqlite3 *)0x0) {
    return (int)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  }
  if (((anonymous_namespace)::SQLiteBuildDB::open(std::__cxx11::string*)::sqliteConfigureResult ==
       '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::SQLiteBuildDB::open(std::__cxx11::string*)
                                   ::sqliteConfigureResult,__file,___oflag), iVar2 != 0)) {
    open::sqliteConfigureResult = sqlite3_config(2);
    __cxa_guard_release(&(anonymous_namespace)::SQLiteBuildDB::open(std::__cxx11::string*)::
                         sqliteConfigureResult);
  }
  if ((open::sqliteConfigureResult != 0) && (iVar2 = sqlite3_threadsafe(), iVar2 == 0)) {
    std::__cxx11::string::assign(__file);
    return 0;
  }
  ppsVar1 = &this->db;
  iVar2 = sqlite3_open((this->path)._M_dataplus._M_p,ppsVar1);
  if (iVar2 != 0) {
    pcVar4 = (char *)sqlite3_errstr(iVar2);
    std::__cxx11::string::string((string *)&local_1f0,pcVar4,(allocator *)&local_210);
    std::operator+(&local_250,"unable to open database: ",&local_1f0);
    std::__cxx11::string::operator=((string *)__file,(string *)&local_250);
    std::__cxx11::string::_M_dispose();
    goto LAB_0014fa9c;
  }
  sqlite3_busy_timeout(*ppsVar1,5000);
  __val = 0;
  iVar2 = -1;
  iVar3 = sqlite3_prepare_v2(*ppsVar1,"SELECT version,client_version FROM info LIMIT 1",0xffffffff,
                             &stmt,0);
  if (iVar3 == 0) {
    iVar2 = sqlite3_step(stmt);
    if (iVar2 == 0x65) {
      __val = 0;
      iVar2 = -1;
    }
    else {
      if (iVar2 != 100) {
        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_250,this);
        std::__cxx11::string::operator=((string *)__file,(string *)&local_250);
        std::__cxx11::string::_M_dispose();
        sqlite3_finalize(stmt);
        return 0;
      }
      iVar2 = sqlite3_column_count(stmt);
      if (iVar2 != 2) {
        __assert_fail("sqlite3_column_count(stmt) == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                      ,0xa3,"bool (anonymous namespace)::SQLiteBuildDB::open(std::string *)");
      }
      iVar2 = sqlite3_column_int(stmt,0);
      __val = sqlite3_column_int(stmt,1);
    }
    sqlite3_finalize(stmt);
LAB_0014f919:
    if ((iVar2 != 0x11) || (__val != this->clientSchemaVersion)) {
      sqlite3_close(this->db);
      this->db = (sqlite3 *)0x0;
      if (this->recreateOnUnmatchedVersion == false) {
        std::__cxx11::string::string
                  ((string *)&local_f0,"Version mismatch. (database-schema: ",&local_259);
        std::__cxx11::to_string(&local_110,iVar2);
        std::operator+(&local_d0,&local_f0,&local_110);
        std::__cxx11::string::string((string *)&local_130," requested schema: ",&local_25a);
        std::operator+(&local_b0,&local_d0,&local_130);
        std::__cxx11::to_string(&local_150,0x11);
        std::operator+(&local_90,&local_b0,&local_150);
        std::__cxx11::string::string((string *)&local_170,". database-client: ",&local_25b);
        std::operator+(&local_1d0,&local_90,&local_170);
        std::__cxx11::to_string(&local_190,__val);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cError,
                       &local_1d0,&local_190);
        std::__cxx11::string::string((string *)&local_1b0," requested client: ",&local_25c);
        std::operator+(&local_210,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cError,
                       &local_1b0);
        std::__cxx11::to_string(&local_50,this->clientSchemaVersion);
        std::operator+(&local_1f0,&local_210,&local_50);
        std::__cxx11::string::string((string *)&local_70,")",&local_25d);
        std::operator+(&local_250,&local_1f0,&local_70);
        std::__cxx11::string::operator=((string *)__file,(string *)&local_250);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        goto LAB_0014fa9c;
      }
      iVar2 = llbuild::basic::sys::unlink((this->path)._M_dataplus._M_p);
      if (iVar2 == -1) {
        piVar6 = __errno_location();
        if (*piVar6 != 2) {
          std::__cxx11::string::string
                    ((string *)&local_1f0,"unable to unlink existing database: ",
                     (allocator *)&local_210);
          pcVar4 = strerror(*piVar6);
          std::operator+(&local_250,&local_1f0,pcVar4);
          std::__cxx11::string::operator=((string *)__file,(string *)&local_250);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          goto LAB_0014fef6;
        }
      }
      else {
        iVar2 = sqlite3_open((this->path)._M_dataplus._M_p,ppsVar1);
        if (iVar2 != 0) goto LAB_0014fa7e;
      }
      iVar2 = sqlite3_exec(*ppsVar1,"BEGIN EXCLUSIVE;",0,0,&cError);
      if ((iVar2 == 0) &&
         (iVar2 = sqlite3_exec(*ppsVar1,
                               "CREATE TABLE info (id INTEGER PRIMARY KEY, version INTEGER, client_version INTEGER, iteration INTEGER);"
                               ,0,0,&cError), iVar2 == 0)) {
        uVar5 = sqlite3_mprintf("INSERT INTO info VALUES (0, %d, %d, 0);",0x11,
                                this->clientSchemaVersion);
        iVar2 = sqlite3_exec(this->db,uVar5,0,0,&cError);
        sqlite3_free(uVar5);
        if ((iVar2 == 0) &&
           ((((iVar2 = sqlite3_exec(*ppsVar1,
                                    "CREATE TABLE key_names (id INTEGER PRIMARY KEY, key STRING UNIQUE);"
                                    ,0,0,&cError), iVar2 == 0 &&
              (iVar2 = sqlite3_exec(*ppsVar1,
                                    "CREATE TABLE rule_results (key_id INTEGER PRIMARY KEY, value BLOB, signature INTEGER, built_at INTEGER, computed_at INTEGER, start REAL, end REAL, dependencies BLOB, FOREIGN KEY(key_id) REFERENCES key_names(id));"
                                    ,0,0,&cError), iVar2 == 0)) &&
             (iVar2 = sqlite3_exec(*ppsVar1,
                                   "CREATE UNIQUE INDEX rule_results_idx ON rule_results (key_id);",
                                   0,0,&cError), iVar2 == 0)) &&
            (iVar2 = sqlite3_exec(*ppsVar1,"END;",0,0,&cError), iVar2 == 0)))) goto LAB_0014f92c;
      }
      std::__cxx11::string::string
                ((string *)&local_210,"unable to initialize database (",(allocator *)&local_1d0);
      std::operator+(&local_1f0,&local_210,cError);
      std::operator+(&local_250,&local_1f0,")");
      std::__cxx11::string::operator=((string *)__file,(string *)&local_250);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      sqlite3_free(cError);
LAB_0014fef6:
      sqlite3_close(*ppsVar1);
      *ppsVar1 = (sqlite3 *)0x0;
      return 0;
    }
LAB_0014f92c:
    iVar2 = sqlite3_prepare_v2(this->db,"SELECT id FROM key_names WHERE key == ? LIMIT 1;",
                               0xffffffffffffffff,&this->findKeyIDForKeyStmt,0);
    if (((((iVar2 == 0) &&
          (iVar2 = sqlite3_prepare_v2(this->db,"SELECT key FROM key_names WHERE id == ? LIMIT 1;",
                                      0xffffffffffffffff,&this->findKeyNameForKeyIDStmt,0),
          iVar2 == 0)) &&
         ((iVar2 = sqlite3_prepare_v2(this->db,"INSERT OR IGNORE INTO key_names(key) VALUES (?);",
                                      0xffffffffffffffff,&this->insertIntoKeysStmt,0), iVar2 == 0 &&
          ((iVar2 = sqlite3_prepare_v2(this->db,
                                       "INSERT OR REPLACE INTO rule_results VALUES (?, ?, ?, ?, ?, ?, ?, ?);"
                                       ,0xffffffffffffffff,&this->insertIntoRuleResultsStmt,0),
           iVar2 == 0 &&
           (iVar2 = sqlite3_prepare_v2(this->db,"DELETE FROM key_names WHERE key == ?;",
                                       0xffffffffffffffff,&this->deleteFromKeysStmt,0), iVar2 == 0))
          )))) && (iVar2 = sqlite3_prepare_v2(this->db,
                                              "SELECT rule_results.key_id, value, built_at, computed_at, start, end, dependencies, signature FROM rule_results INNER JOIN key_names ON key_names.id = rule_results.key_id WHERE key == ?;"
                                              ,0xffffffffffffffff,&this->findRuleResultStmt,0),
                  iVar2 == 0)) &&
       ((iVar2 = sqlite3_prepare_v2(this->db,
                                    "SELECT key_id, value, built_at, computed_at, start, end, dependencies, signature FROM rule_results WHERE key_id == ?;"
                                    ,0xffffffffffffffff,&this->fastFindRuleResultStmt,0), iVar2 == 0
        && (uVar5 = sqlite3_prepare_v2(this->db,
                                       "SELECT rule_results.key_id, key_names.key, rule_results.value, rule_results.built_at, rule_results.computed_at, rule_results.start, rule_results.end, rule_results.dependencies, rule_results.signature FROM rule_results JOIN key_names WHERE rule_results.key_id == key_names.id;"
                                       ,0xffffffffffffffff,&this->getKeysWithResultStmt,0),
           (int)uVar5 == 0)))) {
      return (int)CONCAT71((int7)((ulong)uVar5 >> 8),1);
    }
  }
  else if (iVar3 == 1) goto LAB_0014f919;
LAB_0014fa7e:
  (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_250,this);
  std::__cxx11::string::operator=((string *)__file,(string *)&local_250);
LAB_0014fa9c:
  std::__cxx11::string::_M_dispose();
  return 0;
}

Assistant:

bool open(std::string *error_out) {
    // The db is opened lazily whenever an operation on it occurs. Thus if it is
    // already open, we don't need to do any further work.
    if (db) return true;

    // Configure SQLite3 on first use.
    //
    // We attempt to set multi-threading mode, but can settle for serialized if
    // the library can't be reinitialized (there are only two modes).
    static int sqliteConfigureResult = []() -> int {
      // We access a single connection from multiple threads.
      return sqlite3_config(SQLITE_CONFIG_MULTITHREAD);
    }();
    if (sqliteConfigureResult != SQLITE_OK) {
        if (!sqlite3_threadsafe()) {
            *error_out = "unable to configure database: not thread-safe";
            return false;
        }
    }

    int result = sqlite3_open(path.c_str(), &db);
    if (result != SQLITE_OK) {
      *error_out = "unable to open database: " + std::string(
          sqlite3_errstr(result));
      return false;
    }

    sqlite3_busy_timeout(db, 5000);
    // Create the database schema, if necessary.
    char *cError;
    int version;
    uint32_t clientVersion = 0;
    sqlite3_stmt* stmt;
    result = sqlite3_prepare_v2(
      db, "SELECT version,client_version FROM info LIMIT 1",
      -1, &stmt, nullptr);
    if (result == SQLITE_ERROR) {
      version = -1;
    } else {
      if (result != SQLITE_OK) {
        *error_out = getCurrentErrorMessage();
        return false;
      }
      result = sqlite3_step(stmt);
      if (result == SQLITE_DONE) {
        version = -1;
      } else if (result == SQLITE_ROW) {
        assert(sqlite3_column_count(stmt) == 2);
        version = sqlite3_column_int(stmt, 0);
        clientVersion = sqlite3_column_int(stmt, 1);
      } else {
        *error_out = getCurrentErrorMessage();
        sqlite3_finalize(stmt);
        return false;
      }
      sqlite3_finalize(stmt);
    }

    if (version != currentSchemaVersion ||
        clientVersion != clientSchemaVersion) {
      // Close the database before we try to recreate it.
      sqlite3_close(db);
      db = nullptr;
      
      if (!recreateOnUnmatchedVersion) {
        // We don't re-create the database in this case and return an error
        *error_out = std::string("Version mismatch. (database-schema: ") + std::to_string(version) + std::string(" requested schema: ") + std::to_string(currentSchemaVersion) + std::string(". database-client: ") + std::to_string(clientVersion) + std::string(" requested client: ") + std::to_string(clientSchemaVersion) + std::string(")");
        return false;
      }

      // Always recreate the database from scratch when the schema changes.
      result = basic::sys::unlink(path.c_str());
      if (result == -1) {
        if (errno != ENOENT) {
          *error_out = std::string("unable to unlink existing database: ") +
            ::strerror(errno);
          sqlite3_close(db);
          db = nullptr;
          return false;
        }
      } else {
        // If the remove was successful, reopen the database.
        int result = sqlite3_open(path.c_str(), &db);
        if (result != SQLITE_OK) {
          *error_out = getCurrentErrorMessage();
          return false;
        }
      }

      // Create the schema in a single transaction.
      result = sqlite3_exec(db, "BEGIN EXCLUSIVE;", nullptr, nullptr, &cError);

      // Create the info table.
      if (result == SQLITE_OK) {
        result = sqlite3_exec(
          db, ("CREATE TABLE info ("
               "id INTEGER PRIMARY KEY, "
               "version INTEGER, "
               "client_version INTEGER, "
               "iteration INTEGER);"),
          nullptr, nullptr, &cError);
      }
      if (result == SQLITE_OK) {
        char* query = sqlite3_mprintf(
          "INSERT INTO info VALUES (0, %d, %d, 0);",
          currentSchemaVersion, clientSchemaVersion);
        result = sqlite3_exec(db, query, nullptr, nullptr, &cError);
        sqlite3_free(query);
      }
      if (result == SQLITE_OK) {
        result = sqlite3_exec(
          db, ("CREATE TABLE key_names ("
               "id INTEGER PRIMARY KEY, "
               "key STRING UNIQUE);"),
          nullptr, nullptr, &cError);
      }
      if (result == SQLITE_OK) {
        result = sqlite3_exec(
          db, ("CREATE TABLE rule_results ("
               "key_id INTEGER PRIMARY KEY, "
               "value BLOB, "
               "signature INTEGER, "
               "built_at INTEGER, "
               "computed_at INTEGER, "
               "start REAL, "
               "end REAL, "
               "dependencies BLOB, "
               "FOREIGN KEY(key_id) REFERENCES key_names(id));"),
          nullptr, nullptr, &cError);
      }

      // Create the indices on the rule tables.
      if (result == SQLITE_OK) {
        // Create an index to be used for efficiently looking up rule
        // information from a key.
        result = sqlite3_exec(
            db, "CREATE UNIQUE INDEX rule_results_idx ON rule_results (key_id);",
            nullptr, nullptr, &cError);
      }

      // Sync changes to disk.
      if (result == SQLITE_OK) {
        result = sqlite3_exec(db, "END;", nullptr, nullptr, &cError);
      }

      if (result != SQLITE_OK) {
        *error_out = (std::string("unable to initialize database (") + cError
                      + ")");
        sqlite3_free(cError);
        sqlite3_close(db);
        db = nullptr;
        return false;
      }
    }

    // Initialize prepared statements.
    result = sqlite3_prepare_v2(
      db, findKeyIDForKeyStmtSQL,
      -1, &findKeyIDForKeyStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, findKeyNameForKeyIDStmtSQL,
      -1, &findKeyNameForKeyIDStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, insertIntoKeysStmtSQL,
      -1, &insertIntoKeysStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, insertIntoRuleResultsStmtSQL,
      -1, &insertIntoRuleResultsStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, deleteFromKeysStmtSQL,
      -1, &deleteFromKeysStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, findRuleResultStmtSQL,
      -1, &findRuleResultStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, fastFindRuleResultStmtSQL,
      -1, &fastFindRuleResultStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);
    
    result = sqlite3_prepare_v2(
      db, getKeysWithResultStmtSQL,
      -1, &getKeysWithResultStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    return true;
  }